

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

void CBB_cleanup(CBB *cbb)

{
  if (cbb->is_child != '\0') {
    __assert_fail("!cbb->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x3c,"void CBB_cleanup(CBB *)");
  }
  if ((*(byte *)((long)&cbb->u + 0x18) & 1) == 0) {
    return;
  }
  OPENSSL_free((cbb->u).base.buf);
  return;
}

Assistant:

void CBB_cleanup(CBB *cbb) {
  // Child |CBB|s are non-owning. They are implicitly discarded and should not
  // be used with |CBB_cleanup| or |ScopedCBB|.
  assert(!cbb->is_child);
  if (cbb->is_child) {
    return;
  }

  if (cbb->u.base.can_resize) {
    OPENSSL_free(cbb->u.base.buf);
  }
}